

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_indicator_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2ebe27::ServiceIndicatorTest_BasicTest_Test::TestBody
          (ServiceIndicatorTest_BasicTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  evp_aead_ctx_st *peVar3;
  EVP_AEAD *pEVar4;
  char *pcVar5;
  AssertHelper local_588;
  Message local_580;
  FIPSStatus local_574;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_540;
  Message local_538;
  anon_class_40_5_b57311f2 local_530;
  int local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4d0;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__2;
  Message local_4a0;
  FIPSStatus local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_460;
  Message local_458;
  anon_class_32_4_e0f2363c local_450;
  int local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_3f8;
  Message local_3f0;
  int local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_;
  size_t out_len;
  uint8_t output [256];
  uint8_t nonce [32];
  undefined1 local_2a0 [8];
  ScopedEVP_AEAD_CTX aead_ctx;
  AssertHelper local_58;
  Message local_50 [3];
  unsigned_long local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  uint64_t before;
  ServiceIndicatorTest_BasicTest_Test *pSStack_10;
  FIPSStatus approved;
  ServiceIndicatorTest_BasicTest_Test *this_local;
  
  before._4_4_ = 0;
  pSStack_10 = this;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )FIPS_service_indicator_before_call();
  local_38 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_30,"before","(uint64_t)0",(unsigned_long *)&gtest_ar.message_,
             &local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
               ,0x960,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  aead_ctx.ctx_._573_3_ = 0;
  aead_ctx.ctx_._572_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (aead_ctx.ctx_._572_4_ == 0) {
    bssl::internal::StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
    ::StackAllocated((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                      *)local_2a0);
    output[0xf8] = '\0';
    output[0xf9] = '\0';
    output[0xfa] = '\0';
    output[0xfb] = '\0';
    output[0xfc] = '\0';
    output[0xfd] = '\0';
    output[0xfe] = '\0';
    output[0xff] = '\0';
    peVar3 = bssl::internal::
             StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::get
                       ((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                         *)local_2a0);
    pEVar4 = EVP_aead_aes_128_gcm_randnonce();
    pcVar2 = (char *)0x0;
    local_3e4 = EVP_AEAD_CTX_init(peVar3,pEVar4,(anonymous_namespace)::kAESKey,0x10,0,(ENGINE *)0x0)
    ;
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_3e0,&local_3e4,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_3e0,
                 (AssertionResult *)
                 "EVP_AEAD_CTX_init(aead_ctx.get(), EVP_aead_aes_128_gcm_randnonce(), kAESKey, sizeof(kAESKey), 0, nullptr)"
                 ,"false","true",pcVar2);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                 ,0x969,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_3f0);
    }
    aead_ctx.ctx_._573_3_ = 0;
    aead_ctx.ctx_._572_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    if (aead_ctx.ctx_._572_4_ == 0) {
      local_450.approved = (FIPSStatus *)((long)&before + 4);
      local_450.aead_ctx = (ScopedEVP_AEAD_CTX *)local_2a0;
      local_450.output = (uint8_t (*) [256])&out_len;
      local_450.out_len = (size_t *)&gtest_ar_.message_;
      local_42c = TestBody::anon_class_32_4_e0f2363c::operator()(&local_450);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_428,&local_42c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
      if (!bVar1) {
        testing::Message::Message(&local_458);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_428,
                   (AssertionResult *)
                   "[&] { bssl::FIPSIndicatorHelper fips_indicator_helper(&approved); return EVP_AEAD_CTX_seal(aead_ctx.get(), output, &out_len, sizeof(output), nullptr, 0, kPlaintext, sizeof(kPlaintext), nullptr, 0); }()"
                   ,"false","true",pcVar2);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_460,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                   ,0x96d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_460,&local_458);
        testing::internal::AssertHelper::~AssertHelper(&local_460);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_458);
      }
      aead_ctx.ctx_._573_3_ = 0;
      aead_ctx.ctx_._572_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
      if (aead_ctx.ctx_._572_4_ == 0) {
        local_494 = APPROVED;
        testing::internal::EqHelper::Compare<bssl::FIPSStatus,_bssl::FIPSStatus,_nullptr>
                  ((EqHelper *)local_490,"approved","FIPSStatus::APPROVED",
                   (FIPSStatus *)((long)&before + 4),&local_494);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
        if (!bVar1) {
          testing::Message::Message(&local_4a0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                     ,0x96f,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2.message_,&local_4a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_4a0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
        peVar3 = bssl::internal::
                 StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
                 get((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                      *)local_2a0);
        pEVar4 = EVP_aead_aes_128_gcm();
        pcVar2 = (char *)0x0;
        local_4bc = EVP_AEAD_CTX_init(peVar3,pEVar4,(anonymous_namespace)::kAESKey,0x10,0,
                                      (ENGINE *)0x0);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_4b8,&local_4bc,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
        if (!bVar1) {
          testing::Message::Message(&local_4c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_4b8,
                     (AssertionResult *)
                     "EVP_AEAD_CTX_init(aead_ctx.get(), EVP_aead_aes_128_gcm(), kAESKey, sizeof(kAESKey), 0, nullptr)"
                     ,"false","true",pcVar2);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                     ,0x973,pcVar5);
          testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4d0);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_4c8);
        }
        aead_ctx.ctx_._573_3_ = 0;
        aead_ctx.ctx_._572_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
        if (aead_ctx.ctx_._572_4_ == 0) {
          local_530.approved = (FIPSStatus *)((long)&before + 4);
          local_530.aead_ctx = (ScopedEVP_AEAD_CTX *)local_2a0;
          local_530.output = (uint8_t (*) [256])&out_len;
          local_530.out_len = (size_t *)&gtest_ar_.message_;
          local_530.nonce = (uint8_t (*) [32])(output + 0xf8);
          local_504 = TestBody::anon_class_40_5_b57311f2::operator()(&local_530);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_500,&local_504,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
          if (!bVar1) {
            testing::Message::Message(&local_538);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_2.message_,(internal *)local_500,
                       (AssertionResult *)
                       "[&] { bssl::FIPSIndicatorHelper fips_indicator_helper(&approved); return EVP_AEAD_CTX_seal(aead_ctx.get(), output, &out_len, sizeof(output), nonce, EVP_AEAD_nonce_length(EVP_aead_aes_128_gcm()), kPlaintext, sizeof(kPlaintext), nullptr, 0); }()"
                       ,"false","true",pcVar2);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_540,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                       ,0x978,pcVar2);
            testing::internal::AssertHelper::operator=(&local_540,&local_538);
            testing::internal::AssertHelper::~AssertHelper(&local_540);
            std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_538);
          }
          aead_ctx.ctx_._573_3_ = 0;
          aead_ctx.ctx_._572_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
          if (aead_ctx.ctx_._572_4_ == 0) {
            local_574 = APPROVED;
            testing::internal::EqHelper::Compare<bssl::FIPSStatus,_bssl::FIPSStatus,_nullptr>
                      ((EqHelper *)local_570,"approved","FIPSStatus::APPROVED",
                       (FIPSStatus *)((long)&before + 4),&local_574);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
            if (!bVar1) {
              testing::Message::Message(&local_580);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
              testing::internal::AssertHelper::AssertHelper
                        (&local_588,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                         ,0x979,pcVar2);
              testing::internal::AssertHelper::operator=(&local_588,&local_580);
              testing::internal::AssertHelper::~AssertHelper(&local_588);
              testing::Message::~Message(&local_580);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
            aead_ctx.ctx_._572_4_ = 0;
          }
        }
      }
    }
    bssl::internal::StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
    ::~StackAllocated((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                       *)local_2a0);
  }
  return;
}

Assistant:

TEST(ServiceIndicatorTest, BasicTest) {
  // Reset and check the initial state and counter.
  FIPSStatus approved = FIPSStatus::NOT_APPROVED;
  uint64_t before = FIPS_service_indicator_before_call();
  ASSERT_EQ(before, (uint64_t)0);

  // Call an approved service.
  bssl::ScopedEVP_AEAD_CTX aead_ctx;
  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH] = {0};
  uint8_t output[256];
  size_t out_len;
  ASSERT_TRUE(EVP_AEAD_CTX_init(aead_ctx.get(),
                                EVP_aead_aes_128_gcm_randnonce(), kAESKey,
                                sizeof(kAESKey), 0, nullptr));
  ASSERT_TRUE(CALL_SERVICE_AND_CHECK_APPROVED(
      approved, EVP_AEAD_CTX_seal(aead_ctx.get(), output, &out_len,
                                  sizeof(output), nullptr, 0, kPlaintext,
                                  sizeof(kPlaintext), nullptr, 0)));
  // Macro should return true, to ensure FIPS/non-FIPS compatibility.
  EXPECT_EQ(approved, FIPSStatus::APPROVED);

  // Call a non-approved service.
  ASSERT_TRUE(EVP_AEAD_CTX_init(aead_ctx.get(), EVP_aead_aes_128_gcm(), kAESKey,
                                sizeof(kAESKey), 0, nullptr));
  ASSERT_TRUE(CALL_SERVICE_AND_CHECK_APPROVED(
      approved,
      EVP_AEAD_CTX_seal(aead_ctx.get(), output, &out_len, sizeof(output), nonce,
                        EVP_AEAD_nonce_length(EVP_aead_aes_128_gcm()),
                        kPlaintext, sizeof(kPlaintext), nullptr, 0)));
  EXPECT_EQ(approved, FIPSStatus::APPROVED);
}